

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O1

void write_line(LineArray *line_array,char *line)

{
  uint uVar1;
  char **ppcVar2;
  ulong uVar3;
  
  uVar1 = line_array->cap;
  if (uVar1 <= line_array->count) {
    uVar3 = 8;
    if (7 < uVar1) {
      uVar3 = (ulong)(uVar1 * 2);
    }
    line_array->cap = (uint32_t)uVar3;
    ppcVar2 = (char **)reallocate(line_array->lines,uVar3 << 3);
    line_array->lines = ppcVar2;
  }
  uVar1 = line_array->count;
  line_array->count = uVar1 + 1;
  line_array->lines[uVar1] = line;
  return;
}

Assistant:

void write_line(LineArray *line_array, char *line) {
    if (line_array->count >= line_array->cap) {
        line_array->cap = GROW_CAP(line_array->cap);
        line_array->lines = GROW_ARR(line_array->lines, char *, line_array->cap);
    }

    line_array->lines[line_array->count++] = line;
}